

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Pointer ft_module_get_service(FT_Module module,char *service_id,FT_Bool global)

{
  uint uVar1;
  FT_Module_Requester p_Var2;
  FT_Library pFVar3;
  FT_Module pFVar4;
  FT_Pointer pvVar5;
  FT_Module_Interface pvVar6;
  FT_Module *ppFVar7;
  
  if (module == (FT_Module)0x0) {
    return (FT_Pointer)0x0;
  }
  p_Var2 = module->clazz->get_interface;
  if (p_Var2 == (FT_Module_Requester)0x0) {
    pvVar5 = (FT_Module_Interface)0x0;
  }
  else {
    pvVar5 = (*p_Var2)(module,service_id);
  }
  if ((global != '\0') && (pvVar5 == (FT_Module_Interface)0x0)) {
    pFVar3 = module->library;
    uVar1 = pFVar3->num_modules;
    if ((ulong)uVar1 != 0) {
      ppFVar7 = pFVar3->modules;
      do {
        pFVar4 = *ppFVar7;
        if (((pFVar4 != module) &&
            (p_Var2 = pFVar4->clazz->get_interface, p_Var2 != (FT_Module_Requester)0x0)) &&
           (pvVar6 = (*p_Var2)(pFVar4,service_id), pvVar6 != (FT_Module_Interface)0x0)) {
          return pvVar6;
        }
        ppFVar7 = ppFVar7 + 1;
      } while (ppFVar7 < pFVar3->modules + uVar1);
    }
    pvVar5 = (FT_Pointer)0x0;
  }
  return pvVar5;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_module_get_service( FT_Module    module,
                         const char*  service_id,
                         FT_Bool      global )
  {
    FT_Pointer  result = NULL;


    if ( module )
    {
      FT_ASSERT( module->clazz && module->clazz->get_interface );

      /* first, look for the service in the module */
      if ( module->clazz->get_interface )
        result = module->clazz->get_interface( module, service_id );

      if ( global && !result )
      {
        /* we didn't find it, look in all other modules then */
        FT_Library  library = module->library;
        FT_Module*  cur     = library->modules;
        FT_Module*  limit   = cur + library->num_modules;


        for ( ; cur < limit; cur++ )
        {
          if ( cur[0] != module )
          {
            FT_ASSERT( cur[0]->clazz );

            if ( cur[0]->clazz->get_interface )
            {
              result = cur[0]->clazz->get_interface( cur[0], service_id );
              if ( result )
                break;
            }
          }
        }
      }
    }

    return result;
  }